

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ResultBuilder::useActiveException(ResultBuilder *this,Flags resultDisposition)

{
  int iVar1;
  IRegistryHub *pIVar2;
  undefined4 extraout_var;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  (this->m_assertionInfo).resultDisposition = resultDisposition;
  pIVar2 = getRegistryHub();
  iVar1 = (*pIVar2->_vptr_IRegistryHub[4])(pIVar2);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
            (&local_40,(long *)CONCAT44(extraout_var,iVar1));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->m_stream,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  (this->m_data).resultType = ThrewException;
  captureExpression(this);
  return;
}

Assistant:

void ResultBuilder::useActiveException( ResultDisposition::Flags resultDisposition ) {
        m_assertionInfo.resultDisposition = resultDisposition;
        m_stream.oss << Catch::translateActiveException();
        captureResult( ResultWas::ThrewException );
    }